

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O2

int32_t __thiscall
icu_63::ExtraData::writeNoNoMapping
          (ExtraData *this,UChar32 c,Norm *norm,UnicodeString *dataString,
          Hashtable *previousMappings)

{
  short sVar1;
  int32_t iVar2;
  int32_t iVar3;
  IcuToolErrorCode errorCode;
  UnicodeString newMapping;
  IcuToolErrorCode local_78;
  UnicodeString local_60;
  
  local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b0268;
  local_60.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar2 = writeMapping(this,c,norm,&local_60);
  iVar3 = Hashtable::geti(previousMappings,&local_60);
  if (iVar3 == 0) {
    sVar1 = (dataString->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (dataString->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    UnicodeString::append(dataString,&local_60);
    local_78.super_ErrorCode.errorCode = U_ZERO_ERROR;
    iVar3 = iVar3 + iVar2;
    local_78.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_0039ffb8;
    local_78.location = "gennorm2/writeExtraData()/Hashtable.puti()";
    Hashtable::puti(previousMappings,&local_60,iVar3 + 1,&local_78.super_ErrorCode.errorCode);
    IcuToolErrorCode::~IcuToolErrorCode(&local_78);
  }
  else {
    iVar3 = iVar3 + -1;
  }
  UnicodeString::~UnicodeString(&local_60);
  return iVar3;
}

Assistant:

int32_t ExtraData::writeNoNoMapping(UChar32 c, const Norm &norm,
                                    UnicodeString &dataString,
                                    Hashtable &previousMappings) {
    UnicodeString newMapping;
    int32_t offset=writeMapping(c, norm, newMapping);
    int32_t previousOffset=previousMappings.geti(newMapping);
    if(previousOffset!=0) {
        // Duplicate, point to the identical mapping that has already been stored.
        offset=previousOffset-1;
    } else {
        // Append this new mapping and
        // enter it into the hashtable, avoiding value 0 which is "not found".
        offset=dataString.length()+offset;
        dataString.append(newMapping);
        IcuToolErrorCode errorCode("gennorm2/writeExtraData()/Hashtable.puti()");
        previousMappings.puti(newMapping, offset+1, errorCode);
    }
    return offset;
}